

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O0

void __thiscall
GF2::BFunc<9ul>::To<GF2::MOLex<9ul>>(BFunc<9UL> *this,MP<9UL,_GF2::MOLex<9UL>_> *polyRight)

{
  bool bVar1;
  uint uVar2;
  word x_00;
  Func<9UL,_bool> *in_RDI;
  MM<9UL> x;
  bool bCoeff;
  MM<9UL> mon;
  undefined4 in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  byte saveWeight;
  WW<9UL> *in_stack_ffffffffffffffe8;
  
  MP<9UL,_GF2::MOLex<9UL>_>::operator=
            ((MP<9UL,_GF2::MOLex<9UL>_> *)
             CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
             (bool)in_stack_ffffffffffffffdf);
  MM<9UL>::MM((MM<9UL> *)0x1c919e);
  do {
    saveWeight = 0;
    MM<9UL>::MM((MM<9UL> *)0x1c91ad);
    do {
      bVar1 = MM<9UL>::Calc((MM<9UL> *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8)
                            ,(WW<9UL> *)in_RDI);
      uVar2 = (uint)bVar1;
      x_00 = GF2::WW::operator_cast_to_unsigned_long((WW *)&stack0xffffffffffffffd8);
      bVar1 = Func<9UL,_bool>::Get(in_RDI,x_00);
      saveWeight = (uint)(saveWeight & 1) != (uVar2 & bVar1);
      bVar1 = WW<9UL>::Next(in_stack_ffffffffffffffe8,(bool)saveWeight);
    } while (bVar1);
    if ((saveWeight & 1) != 0) {
      MP<9UL,_GF2::MOLex<9UL>_>::operator+=
                ((MP<9UL,_GF2::MOLex<9UL>_> *)in_RDI,
                 (MM<9UL> *)CONCAT44(uVar2,in_stack_ffffffffffffffc8));
    }
    bVar1 = WW<9UL>::Next(in_stack_ffffffffffffffe8,(bool)saveWeight);
  } while (bVar1);
  return;
}

Assistant:

void To(MP<_n, _O>& polyRight) const
	{	
		polyRight = 0;
		// цикл по мономам
		MM<_n> mon;
		do
		{
			bool bCoeff = 0;
			MM<_n> x;
			do bCoeff ^= x.Calc(mon) & Get(x);
			while (x.Next());
			if (bCoeff)
				polyRight += mon;
		}
		while(mon.Next());
	}